

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rom_parser.c
# Opt level: O2

void cleanup_PRG_and_CHR_banks(void)

{
  uint8_t **__ptr;
  uint8_t **__ptr_00;
  uint8_t bank_num_1;
  ulong uVar1;
  uint8_t bank_num;
  ulong uVar2;
  
  __ptr = PRG_rom_banks;
  uVar1 = (ulong)parsed_header.PRG_ROM_chunks;
  for (uVar2 = 0; __ptr_00 = CHR_rom_banks, uVar2 < uVar1; uVar2 = uVar2 + 1) {
    free(__ptr[uVar2]);
  }
  uVar2 = (ulong)parsed_header.CHR_ROM_chunks;
  for (uVar1 = 0; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    free(__ptr_00[uVar1]);
  }
  free(__ptr);
  free(__ptr_00);
  return;
}

Assistant:

void cleanup_PRG_and_CHR_banks() {
    for(uint8_t bank_num = 0; bank_num < parsed_header.PRG_ROM_chunks; bank_num++) {
        free(PRG_rom_banks[bank_num]);
    }

    for(uint8_t bank_num = 0; bank_num < parsed_header.CHR_ROM_chunks; bank_num++) {
        free(CHR_rom_banks[bank_num]);
    }

    free(PRG_rom_banks);
    free(CHR_rom_banks);
}